

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.cxx
# Opt level: O2

bool cmTargetPropertyComputer::HandleLocationPropertyPolicy(string *tgtName,cmMakefile *mf)

{
  PolicyStatus PVar1;
  ostream *poVar2;
  PolicyID id;
  bool bVar3;
  char *pcVar4;
  MessageType t;
  string local_1c0;
  ostringstream e;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  PVar1 = cmMakefile::GetPolicyStatus(mf,CMP0026,false);
  if (PVar1 - NEW < 3) {
    t = FATAL_ERROR;
    pcVar4 = "may";
    bVar3 = false;
  }
  else {
    bVar3 = true;
    if (PVar1 != WARN) goto LAB_003a1177;
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c0,(cmPolicies *)&DAT_0000001a,id);
    poVar2 = std::operator<<((ostream *)&e,(string *)&local_1c0);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_1c0);
    t = AUTHOR_WARNING;
    bVar3 = true;
    pcVar4 = "should";
  }
  poVar2 = std::operator<<((ostream *)&e,"The LOCATION property ");
  poVar2 = std::operator<<(poVar2,pcVar4);
  poVar2 = std::operator<<(poVar2," not be read from target \"");
  poVar2 = std::operator<<(poVar2,(string *)tgtName);
  std::operator<<(poVar2,
                  "\".  Use the target name directly with add_custom_command, or use the generator expression $<TARGET_FILE>, as appropriate.\n"
                 );
  std::__cxx11::stringbuf::str();
  cmMakefile::IssueMessage(mf,t,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
LAB_003a1177:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return bVar3;
}

Assistant:

bool cmTargetPropertyComputer::HandleLocationPropertyPolicy(
  std::string const& tgtName, cmMakefile const& mf)
{
  std::ostringstream e;
  const char* modal = nullptr;
  MessageType messageType = MessageType::AUTHOR_WARNING;
  switch (mf.GetPolicyStatus(cmPolicies::CMP0026)) {
    case cmPolicies::WARN:
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0026) << "\n";
      modal = "should";
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      break;
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::NEW:
      modal = "may";
      messageType = MessageType::FATAL_ERROR;
      break;
  }

  if (modal) {
    e << "The LOCATION property " << modal << " not be read from target \""
      << tgtName
      << "\".  Use the target name directly with "
         "add_custom_command, or use the generator expression $<TARGET_FILE>, "
         "as appropriate.\n";
    mf.IssueMessage(messageType, e.str());
  }

  return messageType != MessageType::FATAL_ERROR;
}